

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cea708.c
# Opt level: O0

libcaption_stauts_t cea708_to_caption_frame(caption_frame_t *frame,cea708_t *cea708)

{
  uint16_t uVar1;
  libcaption_stauts_t new_stat;
  long in_RSI;
  uint16_t cc_data;
  cea708_cc_type_t type;
  int valid;
  libcaption_stauts_t status;
  int count;
  int i;
  double in_stack_ffffffffffffffc8;
  libcaption_stauts_t old_stat;
  undefined2 in_stack_ffffffffffffffd8;
  cea708_cc_type_t in_stack_ffffffffffffffdc;
  int local_20;
  libcaption_stauts_t local_1c;
  int local_18;
  int local_14;
  long local_10;
  
  local_10 = in_RSI;
  local_18 = cea708_cc_count((user_data_t *)(in_RSI + 0x10));
  local_1c = LIBCAPTION_OK;
  if (*(int *)(local_10 + 8) == 0x47413934) {
    for (local_14 = 0; local_14 < local_18; local_14 = local_14 + 1) {
      uVar1 = cea708_cc_data((user_data_t *)(local_10 + 0x10),local_14,&local_20,
                             (cea708_cc_type_t *)&stack0xffffffffffffffdc);
      if ((local_20 != 0) && (in_stack_ffffffffffffffdc == cc_type_ntsc_cc_field_1)) {
        old_stat = local_1c;
        new_stat = caption_frame_decode
                             ((caption_frame_t *)(ulong)CONCAT22(uVar1,in_stack_ffffffffffffffd8),
                              (uint16_t)(local_1c >> 0x10),in_stack_ffffffffffffffc8);
        local_1c = libcaption_status_update(old_stat,new_stat);
      }
    }
  }
  return local_1c;
}

Assistant:

libcaption_stauts_t cea708_to_caption_frame(caption_frame_t* frame, cea708_t* cea708)
{
    int i, count = cea708_cc_count(&cea708->user_data);
    libcaption_stauts_t status = LIBCAPTION_OK;

    if (GA94 == cea708->user_identifier) {
        for (i = 0; i < count; ++i) {
            int valid;
            cea708_cc_type_t type;
            uint16_t cc_data = cea708_cc_data(&cea708->user_data, i, &valid, &type);

            if (valid && cc_type_ntsc_cc_field_1 == type) {
                status = libcaption_status_update(status, caption_frame_decode(frame, cc_data, cea708->timestamp));
            }
        }
    }

    return status;
}